

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.cpp
# Opt level: O0

bool spvParseUniversalLimitsOptions(char *s,spv_validator_limit *type)

{
  bool bVar1;
  anon_class_8_1_54a39813 local_28;
  anon_class_8_1_54a39813 match;
  spv_validator_limit *type_local;
  char *s_local;
  
  local_28.s = s;
  match.s = (char *)type;
  bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                    (&local_28,"--max-struct-members");
  if (bVar1) {
    match.s[0] = '\0';
    match.s[1] = '\0';
    match.s[2] = '\0';
    match.s[3] = '\0';
  }
  else {
    bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                      (&local_28,"--max-struct_depth");
    if (bVar1) {
      match.s[0] = '\x01';
      match.s[1] = '\0';
      match.s[2] = '\0';
      match.s[3] = '\0';
    }
    else {
      bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                        (&local_28,"--max-local-variables");
      if (bVar1) {
        match.s[0] = '\x02';
        match.s[1] = '\0';
        match.s[2] = '\0';
        match.s[3] = '\0';
      }
      else {
        bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                          (&local_28,"--max-global-variables");
        if (bVar1) {
          match.s[0] = '\x03';
          match.s[1] = '\0';
          match.s[2] = '\0';
          match.s[3] = '\0';
        }
        else {
          bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                            (&local_28,"--max-switch-branches");
          if (bVar1) {
            match.s[0] = '\x03';
            match.s[1] = '\0';
            match.s[2] = '\0';
            match.s[3] = '\0';
          }
          else {
            bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                              (&local_28,"--max-function-args");
            if (bVar1) {
              match.s[0] = '\x05';
              match.s[1] = '\0';
              match.s[2] = '\0';
              match.s[3] = '\0';
            }
            else {
              bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                                (&local_28,"--max-control-flow-nesting-depth");
              if (bVar1) {
                match.s[0] = '\x06';
                match.s[1] = '\0';
                match.s[2] = '\0';
                match.s[3] = '\0';
              }
              else {
                bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                                  (&local_28,"--max-access-chain-indexes");
                if (bVar1) {
                  match.s[0] = '\a';
                  match.s[1] = '\0';
                  match.s[2] = '\0';
                  match.s[3] = '\0';
                }
                else {
                  bVar1 = spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
                                    (&local_28,"--max-id-bound");
                  if (!bVar1) {
                    return false;
                  }
                  match.s[0] = '\b';
                  match.s[1] = '\0';
                  match.s[2] = '\0';
                  match.s[3] = '\0';
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool spvParseUniversalLimitsOptions(const char* s, spv_validator_limit* type) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  if (match("--max-struct-members")) {
    *type = spv_validator_limit_max_struct_members;
  } else if (match("--max-struct_depth")) {
    *type = spv_validator_limit_max_struct_depth;
  } else if (match("--max-local-variables")) {
    *type = spv_validator_limit_max_local_variables;
  } else if (match("--max-global-variables")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-switch-branches")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-function-args")) {
    *type = spv_validator_limit_max_function_args;
  } else if (match("--max-control-flow-nesting-depth")) {
    *type = spv_validator_limit_max_control_flow_nesting_depth;
  } else if (match("--max-access-chain-indexes")) {
    *type = spv_validator_limit_max_access_chain_indexes;
  } else if (match("--max-id-bound")) {
    *type = spv_validator_limit_max_id_bound;
  } else {
    // The command line option for this validator limit has not been added.
    // Therefore we return false.
    return false;
  }

  return true;
}